

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

bool __thiscall
capnp::InterfaceSchema::extends(InterfaceSchema *this,InterfaceSchema other,uint *counter)

{
  bool bVar1;
  unsigned_long *puVar2;
  uint64_t id;
  Schema local_178;
  Schema local_170;
  uint local_164;
  undefined1 local_160 [4];
  uint location;
  Reader superclass;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> *__range1;
  Reader local_d0;
  undefined1 local_a0 [8];
  Reader superclasses;
  Fault local_60;
  Fault f;
  undefined1 local_50 [8];
  DebugComparison<unsigned_int,_const_unsigned_int_&> _kjCondition;
  uint *counter_local;
  InterfaceSchema *this_local;
  InterfaceSchema other_local;
  
  f.exception._0_4_ = *counter;
  *counter = (uint)f.exception + 1;
  _kjCondition._32_8_ = counter;
  this_local = (InterfaceSchema *)other.super_Schema.raw;
  f.exception._4_4_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)&f);
  kj::_::DebugExpression<unsigned_int>::operator<
            ((DebugComparison<unsigned_int,_const_unsigned_int_&> *)local_50,
             (DebugExpression<unsigned_int> *)((long)&f.exception + 4),&MAX_SUPERCLASSES);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (bVar1) {
    bVar1 = Schema::operator==((Schema *)&this_local,&this->super_Schema);
    if (bVar1) {
      other_local.super_Schema.raw._7_1_ = 1;
    }
    else {
      Schema::getProto((Reader *)&__range1,&this->super_Schema);
      capnp::schema::Node::Reader::getInterface(&local_d0,(Reader *)&__range1);
      capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)local_a0,&local_d0);
      ___begin1 = kj::indices<capnp::List<capnp::schema::Superclass,(capnp::Kind)3>::Reader&>
                            ((Reader *)local_a0);
      __end1 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1);
      i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1);
      while( true ) {
        bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end1,(Iterator *)&i);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        puVar2 = kj::Range<unsigned_long>::Iterator::operator*(&__end1);
        superclass._reader._40_8_ = *puVar2;
        List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)local_160,(Reader *)local_a0,(uint)superclass._reader._40_8_);
        local_164 = capnp::_::RawBrandedSchema::makeDepLocation
                              (SUPERCLASS,superclass._reader.nestingLimit);
        id = capnp::schema::Superclass::Reader::getId((Reader *)local_160);
        local_178 = Schema::getDependency(&this->super_Schema,id,local_164);
        local_170.raw = (RawBrandedSchema *)Schema::asInterface(&local_178);
        bVar1 = extends((InterfaceSchema *)&local_170,(InterfaceSchema)this_local,
                        (uint *)_kjCondition._32_8_);
        if (bVar1) {
          other_local.super_Schema.raw._7_1_ = 1;
          goto LAB_0021b094;
        }
        kj::Range<unsigned_long>::Iterator::operator++(&__end1);
      }
      other_local.super_Schema.raw._7_1_ = 0;
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int_const&>&,char_const(&)[53]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x27f,FAILED,"counter++ < MAX_SUPERCLASSES",
               "_kjCondition,\"Cyclic or absurdly-large inheritance graph detected.\"",
               (DebugComparison<unsigned_int,_const_unsigned_int_&> *)local_50,
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    other_local.super_Schema.raw._7_1_ = 0;
    kj::_::Debug::Fault::~Fault(&local_60);
  }
LAB_0021b094:
  return (bool)(other_local.super_Schema.raw._7_1_ & 1);
}

Assistant:

bool InterfaceSchema::extends(InterfaceSchema other, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return false;
  }

  if (other == *this) {
    return true;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    if (getDependency(superclass.getId(), location).asInterface().extends(other, counter)) {
      return true;
    }
  }

  return false;
}